

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_layer_interface.cpp
# Opt level: O2

XrResult ApiLayerInterface::LoadApiLayers
                   (string *openxr_command,uint32_t enabled_api_layer_count,
                   char **enabled_api_layer_names,
                   vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
                   *api_layer_interfaces)

{
  ApiLayerManifestFile *this;
  bool bVar1;
  pointer pXVar2;
  pointer pXVar3;
  pointer puVar4;
  __type _Var5;
  bool bVar6;
  XrResult XVar7;
  XrResult XVar8;
  size_type sVar9;
  iterator __position;
  LoaderPlatformLibraryHandle layer_library;
  string *psVar10;
  code *pcVar11;
  char *pcVar12;
  ostream *poVar13;
  ApiLayerInterface *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *layer_name;
  pointer __k;
  bool bVar14;
  unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
  *enabled_layer_manifest_file;
  pointer puVar15;
  pointer pXVar16;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> extension_properties;
  string warning_message;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_298;
  undefined8 local_280;
  undefined8 local_278;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_268;
  string function_name;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  local_218;
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  local_1f8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layers_already_found;
  string error_message;
  
  layers_already_found._M_h._M_buckets = &layers_already_found._M_h._M_single_bucket;
  layers_already_found._M_h._M_bucket_count = 1;
  layers_already_found._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  layers_already_found._M_h._M_element_count = 0;
  layers_already_found._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  layers_already_found._M_h._M_rehash_policy._M_next_resize = 0;
  layers_already_found._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1f8.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  XVar7 = ApiLayerManifestFile::FindManifestFiles
                    (openxr_command,MANIFEST_TYPE_IMPLICIT_API_LAYER,&local_1f8);
  puVar4 = local_1f8.
           super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar15 = local_1f8.
                 super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar4; puVar15 = puVar15 + 1
      ) {
    std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&layers_already_found,
             &((puVar15->_M_t).
               super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
               ._M_t.
               super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
               .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->_layer_name);
  }
  local_218.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)0x0;
  local_218.
  super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_> *)0x0;
  bVar6 = true;
  if ((XR_ERROR_VALIDATION_FAILURE < XVar7) &&
     (XVar7 = ApiLayerManifestFile::FindManifestFiles
                        (openxr_command,MANIFEST_TYPE_EXPLICIT_API_LAYER,&local_218),
     XR_ERROR_VALIDATION_FAILURE < XVar7)) {
    local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AddEnvironmentApiLayers
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_298);
    if (enabled_api_layer_count == 0) {
LAB_00106300:
      pXVar3 = local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar1 = true;
      bVar6 = true;
      for (__k = local_298.
                 super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl
                 .super__Vector_impl_data._M_start; __k != pXVar3;
          __k = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)&__k->name + 1)) {
        sVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count(&layers_already_found._M_h,(key_type *)__k);
        if (sVar9 == 0) {
          bVar14 = false;
          __position._M_current =
               local_218.
               super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          while (__position._M_current !=
                 local_218.
                 super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
            _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__k,&(((__position._M_current)->_M_t).
                                             super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                                             .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>.
                                            _M_head_impl)->_layer_name);
            if (_Var5) {
              std::__detail::
              _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)&layers_already_found,(value_type *)__k);
              std::
              vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
              ::
              emplace_back<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>
                        ((vector<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>,std::allocator<std::unique_ptr<ApiLayerManifestFile,std::default_delete<ApiLayerManifestFile>>>>
                          *)&local_1f8,__position._M_current);
              bVar14 = true;
              __position = std::
                           vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                           ::erase(&local_218,(const_iterator)__position._M_current);
            }
            else {
              __position._M_current = __position._M_current + 1;
            }
          }
          if (!bVar14) {
            std::__cxx11::string::string
                      ((string *)&error_message,
                       "ApiLayerInterface::LoadApiLayers - failed to find layer ",
                       (allocator *)&warning_message);
            std::__cxx11::string::append((string *)&error_message);
            warning_message._M_dataplus._M_p = (pointer)0x0;
            warning_message._M_string_length = 0;
            warning_message.field_2._M_allocated_capacity = 0;
            LoaderLogger::LogErrorMessage
                      (openxr_command,&error_message,
                       (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                       &warning_message);
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                      ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                       &warning_message);
            std::__cxx11::string::~string((string *)&error_message);
            bVar6 = false;
          }
        }
      }
    }
    else {
      if (enabled_api_layer_names != (char **)0x0) {
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char_const*const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (enabled_api_layer_names,enabled_api_layer_names + enabled_api_layer_count,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_298);
        goto LAB_00106300;
      }
      std::__cxx11::string::string
                ((string *)&error_message,"xrCreateInstance",(allocator *)&extension_properties);
      std::__cxx11::string::string
                ((string *)&warning_message,
                 "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter: enabledApiLayerCount is non-0 but array is NULL"
                 ,(allocator *)&local_268);
      function_name._M_dataplus._M_p = (pointer)0x0;
      function_name._M_string_length = 0;
      function_name.field_2._M_allocated_capacity = 0;
      LoaderLogger::LogErrorMessage
                (&error_message,&warning_message,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&function_name);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&function_name);
      std::__cxx11::string::~string((string *)&warning_message);
      std::__cxx11::string::~string((string *)&error_message);
      std::__cxx11::string::string
                ((string *)&error_message,"xrCreateInstance",(allocator *)&extension_properties);
      std::__cxx11::string::string
                ((string *)&warning_message,
                 "VUID-xrCreateInstance-info-parameter: something wrong with XrInstanceCreateInfo contents"
                 ,(allocator *)&local_268);
      function_name._M_dataplus._M_p = (pointer)0x0;
      function_name._M_string_length = 0;
      function_name.field_2._M_allocated_capacity = 0;
      LoaderLogger::LogErrorMessage
                (&error_message,&warning_message,
                 (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&function_name);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&function_name);
      std::__cxx11::string::~string((string *)&warning_message);
      std::__cxx11::string::~string((string *)&error_message);
      bVar6 = true;
      bVar1 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_298);
    if (!bVar1) {
      XVar7 = XR_ERROR_VALIDATION_FAILURE;
      goto LAB_00106b1a;
    }
  }
  puVar4 = local_1f8.
           super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar1 = false;
  XVar7 = XR_SUCCESS;
  for (puVar15 = local_1f8.
                 super__Vector_base<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar4; puVar15 = puVar15 + 1
      ) {
    layer_library =
         (LoaderPlatformLibraryHandle)
         dlopen((((puVar15->_M_t).
                  super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                  .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->
                super_ManifestFile)._library_path._M_dataplus._M_p,1);
    if (layer_library == (LoaderPlatformLibraryHandle)0x0) {
      if (!bVar1) {
        XVar7 = XR_ERROR_FILE_ACCESS_ERROR;
      }
      pcVar12 = (char *)dlerror();
      std::__cxx11::string::string((string *)&error_message,pcVar12,(allocator *)&warning_message);
      std::__cxx11::string::string
                ((string *)&warning_message,"ApiLayerInterface::LoadApiLayers skipping layer ",
                 (allocator *)&local_298);
      std::__cxx11::string::append((string *)&warning_message);
      std::__cxx11::string::append((char *)&warning_message);
      std::__cxx11::string::append((string *)&warning_message);
      std::__cxx11::string::append((char *)&warning_message);
      local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LoaderLogger::LogWarningMessage(openxr_command,&warning_message,&local_298);
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_298);
      std::__cxx11::string::~string((string *)&warning_message);
      psVar10 = &error_message;
    }
    else {
      this = (puVar15->_M_t).
             super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
             ._M_t.
             super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
             .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl;
      std::__cxx11::string::string
                ((string *)&error_message,"xrNegotiateLoaderApiLayerInterface",
                 (allocator *)&warning_message);
      psVar10 = ManifestFile::GetFunctionName(&this->super_ManifestFile,&error_message);
      std::__cxx11::string::string((string *)&function_name,(string *)psVar10);
      std::__cxx11::string::~string((string *)&error_message);
      if (function_name._M_string_length == 0) {
        __assert_fail("!name.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK/src/loader/loader_platform.hpp"
                      ,0x40,
                      "void *LoaderPlatformLibraryGetProcAddr(LoaderPlatformLibraryHandle, const std::string &)"
                     );
      }
      pcVar11 = (code *)dlsym(layer_library,function_name._M_dataplus._M_p);
      if (pcVar11 == (code *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        poVar13 = std::operator<<((ostream *)&error_message,
                                  "ApiLayerInterface::LoadApiLayers skipping layer ");
        poVar13 = std::operator<<(poVar13,(string *)
                                          &((puVar15->_M_t).
                                            super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                                            .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>.
                                           _M_head_impl)->_layer_name);
        poVar13 = std::operator<<(poVar13," because negotiation function ");
        poVar13 = std::operator<<(poVar13,(string *)&function_name);
        std::operator<<(poVar13," was not found");
        std::__cxx11::stringbuf::str();
        local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LoaderLogger::LogErrorMessage(openxr_command,&warning_message,&local_298);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_298);
        std::__cxx11::string::~string((string *)&warning_message);
        dlclose(layer_library);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        XVar7 = XR_ERROR_API_LAYER_NOT_PRESENT;
      }
      else {
        local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x100000001;
        local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x28;
        local_298.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000001;
        local_280 = 0x1000000000000;
        local_278 = 0x103ff00000fff;
        warning_message.field_2._M_allocated_capacity = 0;
        warning_message.field_2._8_8_ = 0;
        warning_message._M_dataplus._M_p = (pointer)0x100000002;
        warning_message._M_string_length = 0x30;
        XVar8 = (*pcVar11)(&local_298,
                           (((puVar15->_M_t).
                             super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                             .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->
                           _layer_name)._M_dataplus._M_p,&warning_message);
        if (XVar8 < XR_SUCCESS) {
          if (XR_ERROR_VALIDATION_FAILURE < XVar8) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            poVar13 = std::operator<<((ostream *)&error_message,
                                      "ApiLayerInterface::LoadApiLayers succeeded loading layer ");
            poVar13 = std::operator<<(poVar13,(string *)
                                              &((puVar15->_M_t).
                                                super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                                                .
                                                super__Head_base<0UL,_ApiLayerManifestFile_*,_false>
                                               ._M_head_impl)->_layer_name);
            poVar13 = std::operator<<(poVar13," using interface version ");
            poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
            poVar13 = std::operator<<(poVar13," and OpenXR API version ");
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,warning_message.field_2._14_2_);
            poVar13 = std::operator<<(poVar13,".");
            std::ostream::operator<<(poVar13,warning_message.field_2._12_2_);
            std::__cxx11::stringbuf::str();
            local_268.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_268.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_268.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            LoaderLogger::LogInfoMessage(openxr_command,(string *)&extension_properties,&local_268);
            std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                      (&local_268);
            std::__cxx11::string::~string((string *)&extension_properties);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
            error_message._M_dataplus._M_p = (pointer)0x0;
            error_message._M_string_length = 0;
            error_message.field_2._M_allocated_capacity = 0;
            extension_properties.
            super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            extension_properties.
            super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            extension_properties.
            super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ManifestFile::GetInstanceExtensionProperties
                      (&((puVar15->_M_t).
                         super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                         .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>._M_head_impl)->
                        super_ManifestFile,&extension_properties);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error_message,
                      ((long)extension_properties.
                             super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)extension_properties.
                            super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x98);
            pXVar2 = extension_properties.
                     super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pXVar16 = extension_properties.
                           super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_start; pXVar16 != pXVar2;
                pXVar16 = pXVar16 + 1) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char(&)[128]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &error_message,&pXVar16->extensionName);
            }
            this_00 = (ApiLayerInterface *)operator_new(0x58);
            ApiLayerInterface(this_00,&((puVar15->_M_t).
                                        super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                                        .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>.
                                       _M_head_impl)->_layer_name,layer_library,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&error_message,(PFN_xrGetInstanceProcAddr)0x0,
                              (PFN_xrCreateApiLayerInstance)0x0);
            local_268.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
            std::
            vector<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>,std::allocator<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>>>
            ::emplace_back<ApiLayerInterface*>
                      ((vector<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>,std::allocator<std::unique_ptr<ApiLayerInterface,std::default_delete<ApiLayerInterface>>>>
                        *)api_layer_interfaces,(ApiLayerInterface **)&local_268);
            std::_Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>::
            ~_Vector_base(&extension_properties.
                           super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                         );
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&error_message);
            XVar7 = XR_SUCCESS;
            bVar1 = true;
            goto LAB_00106ade;
          }
        }
        else {
          std::__cxx11::string::string
                    ((string *)&error_message,"ApiLayerInterface::LoadApiLayers skipping layer ",
                     (allocator *)&extension_properties);
          std::__cxx11::string::append((string *)&error_message);
          std::__cxx11::string::append((char *)&error_message);
          extension_properties.
          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          extension_properties.
          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          extension_properties.
          super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          LoaderLogger::LogWarningMessage
                    (openxr_command,&error_message,
                     (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                     &extension_properties);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
                     &extension_properties);
          std::__cxx11::string::~string((string *)&error_message);
          XVar8 = XR_ERROR_FILE_CONTENTS_INVALID;
        }
        if (!bVar1) {
          XVar7 = XVar8;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        poVar13 = std::operator<<((ostream *)&error_message,
                                  "ApiLayerInterface::LoadApiLayers skipping layer ");
        poVar13 = std::operator<<(poVar13,(string *)
                                          &((puVar15->_M_t).
                                            super___uniq_ptr_impl<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_ApiLayerManifestFile_*,_std::default_delete<ApiLayerManifestFile>_>
                                            .super__Head_base<0UL,_ApiLayerManifestFile_*,_false>.
                                           _M_head_impl)->_layer_name);
        poVar13 = std::operator<<(poVar13," due to failed negotiation with error ");
        std::ostream::operator<<(poVar13,XVar8);
        std::__cxx11::stringbuf::str();
        local_268.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_268.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_268.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        LoaderLogger::LogWarningMessage(openxr_command,(string *)&extension_properties,&local_268);
        std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_268);
        std::__cxx11::string::~string((string *)&extension_properties);
        dlclose(layer_library);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      }
LAB_00106ade:
      psVar10 = &function_name;
    }
    std::__cxx11::string::~string((string *)psVar10);
  }
  XVar8 = XR_ERROR_API_LAYER_NOT_PRESENT;
  if (bVar6) {
    XVar8 = XVar7;
  }
  if (XVar8 < XR_SUCCESS) {
    std::
    vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
    ::clear(api_layer_interfaces);
    XVar7 = XVar8;
  }
LAB_00106b1a:
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector(&local_218);
  std::
  vector<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>,_std::allocator<std::unique_ptr<ApiLayerManifestFile,_std::default_delete<ApiLayerManifestFile>_>_>_>
  ::~vector(&local_1f8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&layers_already_found._M_h);
  return XVar7;
}

Assistant:

XrResult ApiLayerInterface::LoadApiLayers(const std::string& openxr_command, uint32_t enabled_api_layer_count,
                                          const char* const* enabled_api_layer_names,
                                          std::vector<std::unique_ptr<ApiLayerInterface>>& api_layer_interfaces) {
    XrResult last_error = XR_SUCCESS;
    std::unordered_set<std::string> layers_already_found;

    bool any_loaded = false;
    std::vector<std::unique_ptr<ApiLayerManifestFile>> enabled_layer_manifest_files_in_init_order = {};

    // Find any implicit layers.
    XrResult result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_IMPLICIT_API_LAYER,
                                                              enabled_layer_manifest_files_in_init_order);

    for (const auto& enabled_layer_manifest_file : enabled_layer_manifest_files_in_init_order) {
        layers_already_found.insert(enabled_layer_manifest_file->LayerName());
    }

    // Find any explicit layers.
    std::vector<std::unique_ptr<ApiLayerManifestFile>> explicit_layer_manifest_files = {};

    if (XR_SUCCEEDED(result)) {
        result = ApiLayerManifestFile::FindManifestFiles(openxr_command, MANIFEST_TYPE_EXPLICIT_API_LAYER,
                                                         explicit_layer_manifest_files);
    }

    bool found_all_layers = true;

    if (XR_SUCCEEDED(result)) {
        // Put all explicit and then xrCreateInstance enabled layers into a string vector

        std::vector<std::string> enabled_explicit_api_layer_names = {};

        AddEnvironmentApiLayers(enabled_explicit_api_layer_names);

        if (enabled_api_layer_count > 0) {
            if (nullptr == enabled_api_layer_names) {
                LoaderLogger::LogErrorMessage(
                    "xrCreateInstance",
                    "VUID-XrInstanceCreateInfo-enabledApiLayerNames-parameter: enabledApiLayerCount is non-0 but array is NULL");
                LoaderLogger::LogErrorMessage(
                    "xrCreateInstance", "VUID-xrCreateInstance-info-parameter: something wrong with XrInstanceCreateInfo contents");
                return XR_ERROR_VALIDATION_FAILURE;
            }

            std::copy(enabled_api_layer_names, enabled_api_layer_names + enabled_api_layer_count,
                      std::back_inserter(enabled_explicit_api_layer_names));
        }

        // add explicit layers to list of layers to enable
        for (const auto& layer_name : enabled_explicit_api_layer_names) {
            bool found_this_layer = false;

            if (layers_already_found.count(layer_name) > 0) {
                found_this_layer = true;
            } else {
                for (auto it = explicit_layer_manifest_files.begin(); it != explicit_layer_manifest_files.end();) {
                    bool erased_layer_manifest_file = false;

                    if (layer_name == (*it)->LayerName()) {
                        found_this_layer = true;
                        layers_already_found.insert(layer_name);
                        enabled_layer_manifest_files_in_init_order.push_back(std::move(*it));
                        it = explicit_layer_manifest_files.erase(it);
                        erased_layer_manifest_file = true;
                    }

                    if (!erased_layer_manifest_file) {
                        it++;
                    }
                }
            }

            // If even one of the layers wasn't found, we want to return an error
            if (!found_this_layer) {
                found_all_layers = false;
                std::string error_message = "ApiLayerInterface::LoadApiLayers - failed to find layer ";
                error_message += layer_name;
                LoaderLogger::LogErrorMessage(openxr_command, error_message);
            }
        }
    }

    for (std::unique_ptr<ApiLayerManifestFile>& manifest_file : enabled_layer_manifest_files_in_init_order) {
        LoaderPlatformLibraryHandle layer_library = LoaderPlatformLibraryOpen(manifest_file->LibraryPath());
        if (nullptr == layer_library) {
            if (!any_loaded) {
                last_error = XR_ERROR_FILE_ACCESS_ERROR;
            }
            std::string library_message = LoaderPlatformLibraryOpenError(manifest_file->LibraryPath());
            std::string warning_message = "ApiLayerInterface::LoadApiLayers skipping layer ";
            warning_message += manifest_file->LayerName();
            warning_message += ", failed to load with message \"";
            warning_message += library_message;
            warning_message += "\"";
            LoaderLogger::LogWarningMessage(openxr_command, warning_message);
            continue;
        }
#ifdef XR_KHR_LOADER_INIT_SUPPORT
        if (!LoaderInitData::instance().initialized()) {
            LoaderLogger::LogErrorMessage(openxr_command, "ApiLayerInterface::LoadApiLayers skipping manifest file " +
                                                              manifest_file->Filename() +
                                                              " because xrInitializeLoaderKHR was not yet called.");

            LoaderPlatformLibraryClose(layer_library);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        bool forwardedInitLoader = false;
        {
            // If we have xrInitializeLoaderKHR exposed as an export, forward call to it.
            const auto function_name = manifest_file->GetFunctionName("xrInitializeLoaderKHR");
            auto initLoader =
                reinterpret_cast<PFN_xrInitializeLoaderKHR>(LoaderPlatformLibraryGetProcAddr(layer_library, function_name));
            if (initLoader != nullptr) {
                // we found the entry point one way or another.
                LoaderLogger::LogInfoMessage(openxr_command,
                                             "ApiLayerInterface::LoadApiLayers forwarding xrInitializeLoaderKHR call to API layer "
                                             "before calling xrNegotiateLoaderApiLayerInterface.");
                XrResult res = initLoader(LoaderInitData::instance().getParam());
                if (!XR_SUCCEEDED(res)) {
                    LoaderLogger::LogErrorMessage(
                        openxr_command, "ApiLayerInterface::LoadApiLayers forwarded call to xrInitializeLoaderKHR failed.");

                    LoaderPlatformLibraryClose(layer_library);
                    return res;
                }
                forwardedInitLoader = true;
            }
        }
#endif

        // Get and settle on an layer interface version (using any provided name if required).
        std::string function_name = manifest_file->GetFunctionName("xrNegotiateLoaderApiLayerInterface");
        auto negotiate = reinterpret_cast<PFN_xrNegotiateLoaderApiLayerInterface>(
            LoaderPlatformLibraryGetProcAddr(layer_library, function_name));

        if (nullptr == negotiate) {
            std::ostringstream oss;
            oss << "ApiLayerInterface::LoadApiLayers skipping layer " << manifest_file->LayerName()
                << " because negotiation function " << function_name << " was not found";
            LoaderLogger::LogErrorMessage(openxr_command, oss.str());
            LoaderPlatformLibraryClose(layer_library);
            last_error = XR_ERROR_API_LAYER_NOT_PRESENT;
            continue;
        }

        // Loader info for negotiation
        XrNegotiateLoaderInfo loader_info = {};
        loader_info.structType = XR_LOADER_INTERFACE_STRUCT_LOADER_INFO;
        loader_info.structVersion = XR_LOADER_INFO_STRUCT_VERSION;
        loader_info.structSize = sizeof(XrNegotiateLoaderInfo);
        loader_info.minInterfaceVersion = 1;
        loader_info.maxInterfaceVersion = XR_CURRENT_LOADER_API_LAYER_VERSION;
        loader_info.minApiVersion = XR_MAKE_VERSION(1, 0, 0);
        loader_info.maxApiVersion = XR_MAKE_VERSION(1, 0x3ff, 0xfff);  // Maximum allowed version for this major version.

        // Set up the layer return structure
        XrNegotiateApiLayerRequest api_layer_info = {};
        api_layer_info.structType = XR_LOADER_INTERFACE_STRUCT_API_LAYER_REQUEST;
        api_layer_info.structVersion = XR_API_LAYER_INFO_STRUCT_VERSION;
        api_layer_info.structSize = sizeof(XrNegotiateApiLayerRequest);

        XrResult res = negotiate(&loader_info, manifest_file->LayerName().c_str(), &api_layer_info);
        // If we supposedly succeeded, but got a nullptr for getInstanceProcAddr
        // then something still went wrong, so return with an error.
        if (XR_SUCCEEDED(res) && nullptr == api_layer_info.getInstanceProcAddr) {
            std::string warning_message = "ApiLayerInterface::LoadApiLayers skipping layer ";
            warning_message += manifest_file->LayerName();
            warning_message += ", negotiation did not return a valid getInstanceProcAddr";
            LoaderLogger::LogWarningMessage(openxr_command, warning_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        }

#ifdef XR_KHR_LOADER_INIT_SUPPORT
        if (XR_SUCCEEDED(res) && !forwardedInitLoader) {
            // Forward initialize loader call, where possible and if we did not do so before.
            PFN_xrVoidFunction initializeVoid = nullptr;
            PFN_xrInitializeLoaderKHR initialize = nullptr;

            // Now we may try asking xrGetInstanceProcAddr on the API layer
            if (XR_SUCCEEDED(api_layer_info.getInstanceProcAddr(XR_NULL_HANDLE, "xrInitializeLoaderKHR", &initializeVoid))) {
                if (initializeVoid == nullptr) {
                    LoaderLogger::LogErrorMessage(openxr_command,
                                                  "ApiLayerInterface::LoadApiLayers got success from xrGetInstanceProcAddr "
                                                  "for xrInitializeLoaderKHR, but output a null pointer.");
                    res = XR_ERROR_RUNTIME_FAILURE;
                } else {
                    initialize = reinterpret_cast<PFN_xrInitializeLoaderKHR>(initializeVoid);
                }
            }
            if (initialize != nullptr) {
                // we found the entry point one way or another.
                LoaderLogger::LogInfoMessage(openxr_command,
                                             "ApiLayerInterface::LoadApiLayers forwarding xrInitializeLoaderKHR call to API layer "
                                             "after calling xrNegotiateLoaderApiLayerInterface.");
                res = initialize(LoaderInitData::instance().getParam());
                if (!XR_SUCCEEDED(res)) {
                    LoaderLogger::LogErrorMessage(
                        openxr_command, "ApiLayerInterface::LoadApiLayers forwarded call to xrInitializeLoaderKHR failed.");
                }
            }
        }
#endif

        if (XR_FAILED(res)) {
            if (!any_loaded) {
                last_error = res;
            }
            std::ostringstream oss;
            oss << "ApiLayerInterface::LoadApiLayers skipping layer " << manifest_file->LayerName()
                << " due to failed negotiation with error " << res;
            LoaderLogger::LogWarningMessage(openxr_command, oss.str());
            LoaderPlatformLibraryClose(layer_library);
            continue;
        }

        {
            std::ostringstream oss;
            oss << "ApiLayerInterface::LoadApiLayers succeeded loading layer " << manifest_file->LayerName()
                << " using interface version " << api_layer_info.layerInterfaceVersion << " and OpenXR API version "
                << XR_VERSION_MAJOR(api_layer_info.layerApiVersion) << "." << XR_VERSION_MINOR(api_layer_info.layerApiVersion);
            LoaderLogger::LogInfoMessage(openxr_command, oss.str());
        }

        // Grab the list of extensions this layer supports for easy filtering after the
        // xrCreateInstance call
        std::vector<std::string> supported_extensions;
        std::vector<XrExtensionProperties> extension_properties;
        manifest_file->GetInstanceExtensionProperties(extension_properties);
        supported_extensions.reserve(extension_properties.size());
        for (XrExtensionProperties& ext_prop : extension_properties) {
            supported_extensions.emplace_back(ext_prop.extensionName);
        }

        // Add this API layer to the vector
        api_layer_interfaces.emplace_back(new ApiLayerInterface(manifest_file->LayerName(), layer_library, supported_extensions,
                                                                api_layer_info.getInstanceProcAddr,
                                                                api_layer_info.createApiLayerInstance));

        // If we load one, clear all errors.
        any_loaded = true;
        last_error = XR_SUCCESS;
    }

    // Set error here to preserve prior error behavior
    if (!found_all_layers) {
        last_error = XR_ERROR_API_LAYER_NOT_PRESENT;
    }

    // If we failed catastrophically for some reason, clean up everything.
    if (XR_FAILED(last_error)) {
        api_layer_interfaces.clear();
    }

    return last_error;
}